

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O0

void __thiscall
nv::DDSHeader::setPixelFormat
          (DDSHeader *this,uint bitcount,uint rmask,uint gmask,uint bmask,uint amask)

{
  int iVar1;
  uint local_28;
  uint total;
  uint amask_local;
  uint bmask_local;
  uint gmask_local;
  uint rmask_local;
  uint bitcount_local;
  DDSHeader *this_local;
  
  if (((rmask & gmask) != 0) &&
     (iVar1 = nvAbort("(rmask & gmask) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                      ,0x292,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)"),
     iVar1 == 1)) {
    raise(5);
  }
  if (((rmask & bmask) != 0) &&
     (iVar1 = nvAbort("(rmask & bmask) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                      ,0x293,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)"),
     iVar1 == 1)) {
    raise(5);
  }
  if (((rmask & amask) != 0) &&
     (iVar1 = nvAbort("(rmask & amask) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                      ,0x294,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)"),
     iVar1 == 1)) {
    raise(5);
  }
  if (((gmask & bmask) != 0) &&
     (iVar1 = nvAbort("(gmask & bmask) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                      ,0x295,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)"),
     iVar1 == 1)) {
    raise(5);
  }
  if (((gmask & amask) != 0) &&
     (iVar1 = nvAbort("(gmask & amask) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                      ,0x296,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)"),
     iVar1 == 1)) {
    raise(5);
  }
  if (((bmask & amask) != 0) &&
     (iVar1 = nvAbort("(bmask & amask) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                      ,0x297,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)"),
     iVar1 == 1)) {
    raise(5);
  }
  (this->pf).flags = 0x40;
  if (amask != 0) {
    (this->pf).flags = (this->pf).flags | 1;
  }
  gmask_local = bitcount;
  if (bitcount == 0) {
    for (local_28 = rmask | gmask | bmask | amask; local_28 != 0; local_28 = local_28 >> 1) {
      gmask_local = gmask_local + 1;
    }
  }
  if (((gmask_local == 0) || (0x20 < gmask_local)) &&
     (iVar1 = nvAbort("bitcount > 0 && bitcount <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/DirectDrawSurface.cpp"
                      ,0x2a9,"void nv::DDSHeader::setPixelFormat(uint, uint, uint, uint, uint)"),
     iVar1 == 1)) {
    raise(5);
  }
  if (gmask_local < 9) {
    gmask_local = 8;
  }
  else if (gmask_local < 0x11) {
    gmask_local = 0x10;
  }
  else if (gmask_local < 0x19) {
    gmask_local = 0x18;
  }
  else {
    gmask_local = 0x20;
  }
  (this->pf).fourcc = 0;
  (this->pf).bitcount = gmask_local;
  (this->pf).rmask = rmask;
  (this->pf).gmask = gmask;
  (this->pf).bmask = bmask;
  (this->pf).amask = amask;
  return;
}

Assistant:

void DDSHeader::setPixelFormat(uint bitcount, uint rmask, uint gmask, uint bmask, uint amask)
{
	// Make sure the masks are correct.
	nvCheck((rmask & gmask) == 0);
	nvCheck((rmask & bmask) == 0);
	nvCheck((rmask & amask) == 0);
	nvCheck((gmask & bmask) == 0);
	nvCheck((gmask & amask) == 0);
	nvCheck((bmask & amask) == 0);

	this->pf.flags = DDPF_RGB;

	if (amask != 0) {
		this->pf.flags |= DDPF_ALPHAPIXELS;
	}

	if (bitcount == 0)
	{
		// Compute bit count from the masks.
		uint total = rmask | gmask | bmask | amask;
		while(total != 0) {
			bitcount++;
			total >>= 1;
		}
	}

	nvCheck(bitcount > 0 && bitcount <= 32);

	// Align to 8.
	if (bitcount <= 8) bitcount = 8;
	else if (bitcount <= 16) bitcount = 16;
	else if (bitcount <= 24) bitcount = 24;
	else bitcount = 32;

	this->pf.fourcc = 0; //findD3D9Format(bitcount, rmask, gmask, bmask, amask);
	this->pf.bitcount = bitcount;
	this->pf.rmask = rmask;
	this->pf.gmask = gmask;
	this->pf.bmask = bmask;
	this->pf.amask = amask;
}